

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::NumberStringBuilder::containsField(NumberStringBuilder *this,Field field)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ValueOrHeapArray<UNumberFormatFields> *pVVar4;
  ulong uVar5;
  
  uVar3 = (ulong)this->fLength;
  if ((long)uVar3 < 1) {
    bVar2 = false;
  }
  else {
    if (this->fUsingHeap == false) {
      pVVar4 = &this->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
    }
    bVar2 = true;
    if (pVVar4->value[this->fZero] != field) {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (uVar3 == uVar5) break;
        uVar1 = uVar5 + 1;
      } while (*(Field *)((long)pVVar4 + uVar5 * 4 + (long)this->fZero * 4) != field);
      return uVar5 < uVar3;
    }
  }
  return bVar2;
}

Assistant:

bool NumberStringBuilder::containsField(Field field) const {
    for (int32_t i = 0; i < fLength; i++) {
        if (field == fieldAt(i)) {
            return true;
        }
    }
    return false;
}